

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat.cpp
# Opt level: O2

void embree::Stat::print(ostream *cout)

{
  ulong uVar1;
  unkuint9 Var2;
  unkuint9 Var3;
  unkuint9 Var4;
  unkuint9 Var5;
  unkuint9 Var6;
  unkuint9 Var7;
  unkuint9 Var8;
  unkuint9 Var9;
  unkuint9 Var10;
  unkuint9 Var11;
  unkuint9 Var12;
  unkuint9 Var13;
  unkuint9 Var14;
  unkuint9 Var15;
  size_t i;
  ostream *poVar16;
  long lVar17;
  ulong uVar18;
  size_t i_1;
  ulong uVar19;
  float local_68;
  
  poVar16 = std::operator<<(cout,"--------- ABSOLUTE ---------");
  std::endl<char,std::char_traits<char>>(poVar16);
  std::operator<<(cout,"  #normal_travs   = ");
  poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa0d8 * 1e-06);
  poVar16 = std::operator<<(poVar16,"M");
  std::endl<char,std::char_traits<char>>(poVar16);
  std::operator<<(cout,"    #nodes        = ");
  poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa0e0 * 1e-06);
  poVar16 = std::operator<<(poVar16,"M");
  std::endl<char,std::char_traits<char>>(poVar16);
  std::operator<<(cout,"    #nodes_xfm    = ");
  poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa320 * 1e-06);
  poVar16 = std::operator<<(poVar16,"M");
  std::endl<char,std::char_traits<char>>(poVar16);
  std::operator<<(cout,"    #leaves       = ");
  poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa0e8 * 1e-06);
  poVar16 = std::operator<<(poVar16,"M");
  std::endl<char,std::char_traits<char>>(poVar16);
  std::operator<<(cout,"    #prims        = ");
  poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa0f0 * 1e-06);
  poVar16 = std::operator<<(poVar16,"M");
  std::endl<char,std::char_traits<char>>(poVar16);
  std::operator<<(cout,"    #prim_hits    = ");
  poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa0f8 * 1e-06);
  poVar16 = std::operator<<(poVar16,"M");
  std::endl<char,std::char_traits<char>>(poVar16);
  std::operator<<(cout,"    #stack nodes  = ");
  poVar16 = std::ostream::_M_insert<double>((double)_DAT_021fa318 * 1e-06);
  poVar16 = std::operator<<(poVar16,"M");
  std::endl<char,std::char_traits<char>>(poVar16);
  std::operator<<(cout,"    #stack pop    = ");
  poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa310 * 1e-06);
  poVar16 = std::operator<<(poVar16,"M");
  std::endl<char,std::char_traits<char>>(poVar16);
  uVar18 = 0;
  uVar19 = 0;
  for (lVar17 = 0; lVar17 != 0x41; lVar17 = lVar17 + 1) {
    uVar19 = uVar19 + (&DAT_021fa100)[lVar17];
    uVar18 = uVar18 + (&DAT_021fa100)[lVar17] * lVar17;
  }
  poVar16 = std::operator<<(cout,"    #hit_boxes    = ");
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::operator<<(poVar16," (total) distribution: ");
  local_68 = 0.0;
  for (lVar17 = 0; lVar17 != 0x41; lVar17 = lVar17 + 1) {
    uVar1 = (&DAT_021fa100)[lVar17];
    poVar16 = std::operator<<(cout,"[");
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    poVar16 = std::operator<<(poVar16,"] ");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,((float)uVar1 * 100.0) / (float)uVar19);
    std::operator<<(poVar16," ");
    local_68 = local_68 + ((float)lVar17 * (float)(ulong)(&DAT_021fa100)[lVar17]) / (float)uVar19;
  }
  poVar16 = std::operator<<(cout,"    average = ");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_68);
  std::endl<char,std::char_traits<char>>(poVar16);
  for (lVar17 = 0; lVar17 != 0x41; lVar17 = lVar17 + 1) {
    poVar16 = std::operator<<(cout,"[");
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    poVar16 = std::operator<<(poVar16,"] ");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,((float)lVar17 * (float)(ulong)(&DAT_021fa100)[lVar17] * 100.0) /
                                 (float)uVar18);
    std::operator<<(poVar16," ");
  }
  std::endl<char,std::char_traits<char>>(cout);
  if (DAT_021fa328 != 0) {
    std::operator<<(cout,"  #shadow_travs = ");
    poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa328 * 1e-06);
    poVar16 = std::operator<<(poVar16,"M");
    std::endl<char,std::char_traits<char>>(poVar16);
    std::operator<<(cout,"    #nodes      = ");
    poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa330 * 1e-06);
    poVar16 = std::operator<<(poVar16,"M");
    std::endl<char,std::char_traits<char>>(poVar16);
    std::operator<<(cout,"    #nodes_xfm  = ");
    poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa570 * 1e-06);
    poVar16 = std::operator<<(poVar16,"M");
    std::endl<char,std::char_traits<char>>(poVar16);
    std::operator<<(cout,"    #leaves     = ");
    poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa338 * 1e-06);
    poVar16 = std::operator<<(poVar16,"M");
    std::endl<char,std::char_traits<char>>(poVar16);
    std::operator<<(cout,"    #prims      = ");
    poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa340 * 1e-06);
    poVar16 = std::operator<<(poVar16,"M");
    std::endl<char,std::char_traits<char>>(poVar16);
    std::operator<<(cout,"    #prim_hits  = ");
    poVar16 = std::ostream::_M_insert<double>((double)DAT_021fa348 * 1e-06);
    poVar16 = std::operator<<(poVar16,"M");
    std::endl<char,std::char_traits<char>>(poVar16);
    std::operator<<(cout,"    #stack nodes = ");
    poVar16 = std::ostream::_M_insert<double>((double)_DAT_021fa568 * 1e-06);
    poVar16 = std::operator<<(poVar16,"M");
    std::endl<char,std::char_traits<char>>(poVar16);
    std::operator<<(cout,"    #stack pop   = ");
    poVar16 = std::ostream::_M_insert<double>((double)_DAT_021fa560 * 1e-06);
    poVar16 = std::operator<<(poVar16,"M");
    std::endl<char,std::char_traits<char>>(poVar16);
    uVar18 = 0;
    uVar19 = 0;
    for (lVar17 = 0; lVar17 != 0x41; lVar17 = lVar17 + 1) {
      uVar19 = uVar19 + *(long *)(&DAT_021fa350 + lVar17 * 8);
      uVar18 = uVar18 + *(long *)(&DAT_021fa350 + lVar17 * 8) * lVar17;
    }
    std::operator<<(cout,"    #hit_boxes    = ");
    for (lVar17 = 0; lVar17 != 0x41; lVar17 = lVar17 + 1) {
      poVar16 = std::operator<<(cout,"[");
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      poVar16 = std::operator<<(poVar16,"] ");
      poVar16 = (ostream *)
                std::ostream::operator<<
                          (poVar16,((float)*(ulong *)(&DAT_021fa350 + lVar17 * 8) * 100.0) /
                                   (float)uVar19);
      std::operator<<(poVar16," ");
    }
    std::endl<char,std::char_traits<char>>(cout);
    for (lVar17 = 0; lVar17 != 0x41; lVar17 = lVar17 + 1) {
      poVar16 = std::operator<<(cout,"[");
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      poVar16 = std::operator<<(poVar16,"] ");
      poVar16 = (ostream *)
                std::ostream::operator<<
                          (poVar16,((float)lVar17 *
                                   (float)*(ulong *)(&DAT_021fa350 + lVar17 * 8) * 100.0) /
                                   (float)uVar18);
      std::operator<<(poVar16," ");
    }
    std::endl<char,std::char_traits<char>>(cout);
  }
  std::endl<char,std::char_traits<char>>(cout);
  poVar16 = std::operator<<(cout,"--------- PER TRAVERSAL ---------");
  std::endl<char,std::char_traits<char>>(poVar16);
  Var2 = (unkuint9)_DAT_021f99e8;
  Var3 = (unkuint9)instance;
  Var4 = (unkuint9)DAT_021f99f0;
  Var5 = (unkuint9)DAT_021f9300;
  Var6 = (unkuint9)DAT_021f9c30;
  Var7 = (unkuint9)DAT_021f9540;
  Var8 = (unkuint9)DAT_021f99f8;
  Var9 = (unkuint9)DAT_021f9308;
  Var10 = (unkuint9)DAT_021f9a00;
  Var11 = (unkuint9)DAT_021f9310;
  Var12 = (unkuint9)DAT_021f9a08;
  Var13 = (unkuint9)DAT_021f9318;
  Var14 = (unkuint9)DAT_021f9c20;
  Var15 = (unkuint9)DAT_021f9530;
  poVar16 = std::operator<<(cout,"  #normal_travs   = ");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa0d8 / (float)DAT_021fa0d8);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)
            std::ostream::operator<<(poVar16,((float)(unkint9)Var2 / (float)(unkint9)Var3) * 100.0);
  poVar16 = std::operator<<(poVar16,"% active");
  std::endl<char,std::char_traits<char>>(poVar16);
  poVar16 = std::operator<<(cout,"    #nodes        = ");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa0e0 / (float)DAT_021fa0d8);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)
            std::ostream::operator<<(poVar16,((float)(unkint9)Var4 / (float)(unkint9)Var5) * 100.0);
  poVar16 = std::operator<<(poVar16,"% active");
  std::endl<char,std::char_traits<char>>(poVar16);
  poVar16 = std::operator<<(cout,"    #node_xfm     = ");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa320 / (float)DAT_021fa0d8);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)
            std::ostream::operator<<(poVar16,((float)(unkint9)Var6 / (float)(unkint9)Var7) * 100.0);
  poVar16 = std::operator<<(poVar16,"% active");
  std::endl<char,std::char_traits<char>>(poVar16);
  poVar16 = std::operator<<(cout,"    #leaves       = ");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa0e8 / (float)DAT_021fa0d8);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)
            std::ostream::operator<<(poVar16,((float)(unkint9)Var8 / (float)(unkint9)Var9) * 100.0);
  poVar16 = std::operator<<(poVar16,"% active");
  std::endl<char,std::char_traits<char>>(poVar16);
  poVar16 = std::operator<<(cout,"    #prims        = ");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa0f0 / (float)DAT_021fa0d8);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)
            std::ostream::operator<<
                      (poVar16,((float)(unkint9)Var10 / (float)(unkint9)Var11) * 100.0);
  poVar16 = std::operator<<(poVar16,"% active");
  std::endl<char,std::char_traits<char>>(poVar16);
  poVar16 = std::operator<<(cout,"    #prim_hits    = ");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa0f8 / (float)DAT_021fa0d8);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)
            std::ostream::operator<<
                      (poVar16,((float)(unkint9)Var12 / (float)(unkint9)Var13) * 100.0);
  poVar16 = std::operator<<(poVar16,"% active");
  std::endl<char,std::char_traits<char>>(poVar16);
  poVar16 = std::operator<<(cout,"    #stack_pop    = ");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa310 / (float)DAT_021fa0d8);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)
            std::ostream::operator<<
                      (poVar16,((float)(unkint9)Var14 / (float)(unkint9)Var15) * 100.0);
  poVar16 = std::operator<<(poVar16,"% active");
  std::endl<char,std::char_traits<char>>(poVar16);
  if (DAT_021f9548 != 0) {
    Var2 = (unkuint9)DAT_021f9c38;
    Var3 = (unkuint9)DAT_021f9548;
    Var4 = (unkuint9)DAT_021f9c40;
    Var5 = (unkuint9)DAT_021f9550;
    Var6 = (unkuint9)DAT_021f9e80;
    Var7 = (unkuint9)DAT_021f9790;
    Var8 = (unkuint9)DAT_021f9c48;
    Var9 = (unkuint9)DAT_021f9558;
    Var10 = (unkuint9)DAT_021f9c50;
    Var11 = (unkuint9)DAT_021f9560;
    Var12 = (unkuint9)DAT_021f9c58;
    Var13 = (unkuint9)DAT_021f9568;
    poVar16 = std::operator<<(cout,"  #shadow_travs = ");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa328 / (float)DAT_021fa328)
    ;
    poVar16 = std::operator<<(poVar16,", ");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,((float)(unkint9)Var2 / (float)(unkint9)Var3) * 100.0);
    poVar16 = std::operator<<(poVar16,"% active");
    std::endl<char,std::char_traits<char>>(poVar16);
    poVar16 = std::operator<<(cout,"    #nodes      = ");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa330 / (float)DAT_021fa328)
    ;
    poVar16 = std::operator<<(poVar16,", ");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,((float)(unkint9)Var4 / (float)(unkint9)Var5) * 100.0);
    poVar16 = std::operator<<(poVar16,"% active");
    std::endl<char,std::char_traits<char>>(poVar16);
    poVar16 = std::operator<<(cout,"    #nodes_xfm  = ");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa570 / (float)DAT_021fa328)
    ;
    poVar16 = std::operator<<(poVar16,", ");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,((float)(unkint9)Var6 / (float)(unkint9)Var7) * 100.0);
    poVar16 = std::operator<<(poVar16,"% active");
    std::endl<char,std::char_traits<char>>(poVar16);
    poVar16 = std::operator<<(cout,"    #leaves     = ");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa338 / (float)DAT_021fa328)
    ;
    poVar16 = std::operator<<(poVar16,", ");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,((float)(unkint9)Var8 / (float)(unkint9)Var9) * 100.0);
    poVar16 = std::operator<<(poVar16,"% active");
    std::endl<char,std::char_traits<char>>(poVar16);
    poVar16 = std::operator<<(cout,"    #prims      = ");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa340 / (float)DAT_021fa328)
    ;
    poVar16 = std::operator<<(poVar16,", ");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,((float)(unkint9)Var10 / (float)(unkint9)Var11) * 100.0);
    poVar16 = std::operator<<(poVar16,"% active");
    std::endl<char,std::char_traits<char>>(poVar16);
    poVar16 = std::operator<<(cout,"    #prim_hits  = ");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(float)DAT_021fa348 / (float)DAT_021fa328)
    ;
    poVar16 = std::operator<<(poVar16,", ");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,((float)(unkint9)Var12 / (float)(unkint9)Var13) * 100.0);
    poVar16 = std::operator<<(poVar16,"% active");
    std::endl<char,std::char_traits<char>>(poVar16);
  }
  std::endl<char,std::char_traits<char>>(cout);
  poVar16 = std::operator<<(cout,"--------- USER ---------");
  std::endl<char,std::char_traits<char>>(poVar16);
  for (lVar17 = 0; lVar17 != 10; lVar17 = lVar17 + 1) {
    poVar16 = std::operator<<(cout,"#user");
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    poVar16 = std::operator<<(poVar16," = ");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,(float)(ulong)(&DAT_021fa7c8)[lVar17] /
                                 (float)(DAT_021f9548 + instance));
    poVar16 = std::operator<<(poVar16," per traversal");
    std::endl<char,std::char_traits<char>>(poVar16);
  }
  poVar16 = std::operator<<(cout,"#user5/user3 ");
  poVar16 = (ostream *)
            std::ostream::operator<<(poVar16,((float)DAT_021fa7f0 * 100.0) / (float)DAT_021fa7e0);
  poVar16 = std::operator<<(poVar16,"%");
  std::endl<char,std::char_traits<char>>(poVar16);
  poVar16 = std::operator<<(cout,"#user6/user3 ");
  poVar16 = (ostream *)
            std::ostream::operator<<(poVar16,((float)DAT_021fa7f8 * 100.0) / (float)DAT_021fa7e0);
  poVar16 = std::operator<<(poVar16,"%");
  std::endl<char,std::char_traits<char>>(poVar16);
  poVar16 = std::operator<<(cout,"#user7/user3 ");
  poVar16 = (ostream *)
            std::ostream::operator<<(poVar16,((float)DAT_021fa800 * 100.0) / (float)DAT_021fa7e0);
  poVar16 = std::operator<<(poVar16,"%");
  std::endl<char,std::char_traits<char>>(poVar16);
  std::endl<char,std::char_traits<char>>(cout);
  return;
}

Assistant:

void Stat::print(embree_ostream cout)
  {
    Counters& cntrs = instance.cntrs;
    Counters::Data& data = instance.cntrs.code;
    //Counters::Data& data = instance.cntrs.active;

    /* print absolute numbers */
    cout << "--------- ABSOLUTE ---------" << std::endl;
    cout << "  #normal_travs   = " << float(data.normal.travs            )*1E-6 << "M" << std::endl;
    cout << "    #nodes        = " << float(data.normal.trav_nodes       )*1E-6 << "M" << std::endl;
    cout << "    #nodes_xfm    = " << float(data.normal.trav_xfm_nodes   )*1E-6 << "M" << std::endl;
    cout << "    #leaves       = " << float(data.normal.trav_leaves      )*1E-6 << "M" << std::endl;
    cout << "    #prims        = " << float(data.normal.trav_prims       )*1E-6 << "M" << std::endl;
    cout << "    #prim_hits    = " << float(data.normal.trav_prim_hits   )*1E-6 << "M" << std::endl;

    cout << "    #stack nodes  = " << float(data.normal.trav_stack_nodes )*1E-6 << "M" << std::endl;
    cout << "    #stack pop    = " << float(data.normal.trav_stack_pop )*1E-6 << "M" << std::endl;

    size_t normal_box_hits = 0;
    size_t weighted_box_hits = 0;
    for (size_t i=0;i<SIZE_HISTOGRAM;i++) { 
      normal_box_hits += data.normal.trav_hit_boxes[i];
      weighted_box_hits += data.normal.trav_hit_boxes[i]*i;
    }
    cout << "    #hit_boxes    = " << normal_box_hits << " (total) distribution: ";
    float average = 0.0f;
    for (size_t i=0;i<SIZE_HISTOGRAM;i++) 
    {
      float value = 100.0f * data.normal.trav_hit_boxes[i] / normal_box_hits;
      cout << "[" << i << "] " << value << " ";
      average += (float)i*data.normal.trav_hit_boxes[i] / normal_box_hits;
    }
    cout << "    average = " << average << std::endl;
    for (size_t i=0;i<SIZE_HISTOGRAM;i++) cout << "[" << i << "] " << 100.0f * data.normal.trav_hit_boxes[i]*i / weighted_box_hits << " ";
    cout << std::endl;

    if (data.shadow.travs) {
      cout << "  #shadow_travs = " << float(data.shadow.travs         )*1E-6 << "M" << std::endl;
      cout << "    #nodes      = " << float(data.shadow.trav_nodes    )*1E-6 << "M" << std::endl;
      cout << "    #nodes_xfm  = " << float(data.shadow.trav_xfm_nodes)*1E-6 << "M" << std::endl;
      cout << "    #leaves     = " << float(data.shadow.trav_leaves   )*1E-6 << "M" << std::endl;
      cout << "    #prims      = " << float(data.shadow.trav_prims    )*1E-6 << "M" << std::endl;
      cout << "    #prim_hits  = " << float(data.shadow.trav_prim_hits)*1E-6 << "M" << std::endl;

      cout << "    #stack nodes = " << float(data.shadow.trav_stack_nodes )*1E-6 << "M" << std::endl;
      cout << "    #stack pop   = " << float(data.shadow.trav_stack_pop )*1E-6 << "M" << std::endl;

      size_t shadow_box_hits = 0;
      size_t weighted_shadow_box_hits = 0;

      for (size_t i=0;i<SIZE_HISTOGRAM;i++) {        
        shadow_box_hits += data.shadow.trav_hit_boxes[i];
        weighted_shadow_box_hits += data.shadow.trav_hit_boxes[i]*i;
      }
      cout << "    #hit_boxes    = ";
      for (size_t i=0;i<SIZE_HISTOGRAM;i++) cout << "[" << i << "] " << 100.0f * data.shadow.trav_hit_boxes[i] / shadow_box_hits << " ";
      cout << std::endl;
      for (size_t i=0;i<SIZE_HISTOGRAM;i++) cout << "[" << i << "] " << 100.0f * data.shadow.trav_hit_boxes[i]*i / weighted_shadow_box_hits << " ";
      cout << std::endl;
    }
    cout << std::endl;

    /* print per traversal numbers */
    cout << "--------- PER TRAVERSAL ---------" << std::endl;
    float active_normal_travs       = float(cntrs.active.normal.travs      )/float(cntrs.all.normal.travs      );
    float active_normal_trav_nodes  = float(cntrs.active.normal.trav_nodes )/float(cntrs.all.normal.trav_nodes );
    float active_normal_trav_xfm_nodes  = float(cntrs.active.normal.trav_xfm_nodes )/float(cntrs.all.normal.trav_xfm_nodes );
    float active_normal_trav_leaves = float(cntrs.active.normal.trav_leaves)/float(cntrs.all.normal.trav_leaves);
    float active_normal_trav_prims   = float(cntrs.active.normal.trav_prims  )/float(cntrs.all.normal.trav_prims  );
    float active_normal_trav_prim_hits = float(cntrs.active.normal.trav_prim_hits  )/float(cntrs.all.normal.trav_prim_hits  );
    float active_normal_trav_stack_pop = float(cntrs.active.normal.trav_stack_pop  )/float(cntrs.all.normal.trav_stack_pop  );

    cout << "  #normal_travs   = " << float(cntrs.code.normal.travs      )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_travs       << "% active" << std::endl;
    cout << "    #nodes        = " << float(cntrs.code.normal.trav_nodes )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_nodes  << "% active" << std::endl;
    cout << "    #node_xfm     = " << float(cntrs.code.normal.trav_xfm_nodes )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_xfm_nodes  << "% active" << std::endl;
    cout << "    #leaves       = " << float(cntrs.code.normal.trav_leaves)/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_leaves << "% active" << std::endl;
    cout << "    #prims        = " << float(cntrs.code.normal.trav_prims  )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_prims   << "% active" << std::endl;
    cout << "    #prim_hits    = " << float(cntrs.code.normal.trav_prim_hits  )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_prim_hits   << "% active" << std::endl;
    cout << "    #stack_pop    = " << float(cntrs.code.normal.trav_stack_pop  )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_stack_pop   << "% active" << std::endl;

    if (cntrs.all.shadow.travs) {
      float active_shadow_travs       = float(cntrs.active.shadow.travs      )/float(cntrs.all.shadow.travs      );
      float active_shadow_trav_nodes  = float(cntrs.active.shadow.trav_nodes )/float(cntrs.all.shadow.trav_nodes );
      float active_shadow_trav_xfm_nodes  = float(cntrs.active.shadow.trav_xfm_nodes )/float(cntrs.all.shadow.trav_xfm_nodes );
      float active_shadow_trav_leaves = float(cntrs.active.shadow.trav_leaves)/float(cntrs.all.shadow.trav_leaves);
      float active_shadow_trav_prims   = float(cntrs.active.shadow.trav_prims  )/float(cntrs.all.shadow.trav_prims  );
      float active_shadow_trav_prim_hits = float(cntrs.active.shadow.trav_prim_hits  )/float(cntrs.all.shadow.trav_prim_hits  );

      cout << "  #shadow_travs = " << float(cntrs.code.shadow.travs      )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_travs       << "% active" << std::endl;
      cout << "    #nodes      = " << float(cntrs.code.shadow.trav_nodes )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_nodes  << "% active" << std::endl;
      cout << "    #nodes_xfm  = " << float(cntrs.code.shadow.trav_xfm_nodes )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_xfm_nodes  << "% active" << std::endl;
      cout << "    #leaves     = " << float(cntrs.code.shadow.trav_leaves)/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_leaves << "% active" << std::endl;
      cout << "    #prims      = " << float(cntrs.code.shadow.trav_prims  )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_prims   << "% active" << std::endl;
      cout << "    #prim_hits  = " << float(cntrs.code.shadow.trav_prim_hits  )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_prim_hits   << "% active" << std::endl;

    }
    cout << std::endl;

     /* print user counters for performance tuning */
    cout << "--------- USER ---------" << std::endl;
    for (size_t i=0; i<10; i++)
      cout << "#user" << i << " = " << float(cntrs.user[i])/float(cntrs.all.normal.travs+cntrs.all.shadow.travs) << " per traversal" << std::endl;

    cout << "#user5/user3 " << 100.0f*float(cntrs.user[5])/float(cntrs.user[3]) << "%" << std::endl;
    cout << "#user6/user3 " << 100.0f*float(cntrs.user[6])/float(cntrs.user[3]) << "%" << std::endl;
    cout << "#user7/user3 " << 100.0f*float(cntrs.user[7])/float(cntrs.user[3]) << "%" << std::endl;
    cout << std::endl;
  }